

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::RotateX(Float theta)

{
  Transform *in_RDI;
  Float in_XMM0_Da;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  SquareMatrix<4> m;
  Float cosTheta;
  Float sinTheta;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff44;
  Transform *pTVar6;
  float in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  Float in_stack_ffffffffffffff84;
  SquareMatrix<4> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  pTVar6 = in_RDI;
  auVar1._0_4_ = Radians(in_XMM0_Da);
  auVar1._4_60_ = extraout_var;
  std::sin(auVar1._0_8_);
  auVar2._0_4_ = Radians(in_XMM0_Da);
  auVar2._4_60_ = extraout_var_00;
  std::cos(auVar2._0_8_);
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  SquareMatrix<4>::SquareMatrix<int,int,int,int,float,float,int,int,float,float,int,int,int,int,int>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff70,(float)((ulong)pTVar6 >> 0x20),(int)pTVar6,
             in_stack_ffffffffffffffc0,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  Transpose<4>(&in_RDI->m);
  Transform::Transform
            ((Transform *)CONCAT44(in_stack_ffffffffffffff44,uVar5),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff3c,uVar4),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff34,uVar3));
  return pTVar6;
}

Assistant:

Transform RotateX(Float theta) {
    Float sinTheta = std::sin(Radians(theta));
    Float cosTheta = std::cos(Radians(theta));
    SquareMatrix<4> m(1,        0,         0, 0,
                      0, cosTheta, -sinTheta, 0,
                      0, sinTheta,  cosTheta, 0,
                      0,        0,         0, 1);
    return Transform(m, Transpose(m));
}